

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void PrintAnswerOut(fstream *fout,vector<int,_std::allocator<int>_> *answer_vector)

{
  bool bVar1;
  reference piVar2;
  ostream *poVar3;
  long in_RDI;
  int answer;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20 [3];
  long local_8;
  
  local_8 = in_RDI;
  local_20[0]._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffffc8);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (local_20);
    in_stack_ffffffffffffffd4 = *piVar2;
    poVar3 = (ostream *)
             std::ostream::operator<<((ostream *)(local_8 + 0x10),in_stack_ffffffffffffffd4);
    std::operator<<(poVar3," ");
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (local_20);
  }
  std::ostream::operator<<((ostream *)(local_8 + 0x10),std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintAnswerOut(std::fstream &fout, std::vector<int> &answer_vector)
{
    for (auto answer : answer_vector) {
        fout << answer << " ";
    }
    fout << std::endl;
}